

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int h264_mb_pred(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  int iVar1;
  uint32_t local_5c;
  uint local_58;
  int max;
  int pmode [4];
  int ifrom [4];
  int j;
  int i;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  if (mb->mb_type < 0x1b) {
    iVar1 = h264_is_intra_16x16_mb_type(mb->mb_type);
    if (iVar1 == 0) {
      if (mb->transform_size_8x8_flag == 0) {
        for (ifrom[3] = 0; ifrom[3] < 0x10; ifrom[3] = ifrom[3] + 1) {
          iVar1 = h264_prev_intra_pred_mode_flag
                            (str,cabac,mb->prev_intra4x4_pred_mode_flag + ifrom[3]);
          if (iVar1 != 0) {
            return 1;
          }
          if ((mb->prev_intra4x4_pred_mode_flag[ifrom[3]] == 0) &&
             (iVar1 = h264_rem_intra_pred_mode(str,cabac,mb->rem_intra4x4_pred_mode + ifrom[3]),
             iVar1 != 0)) {
            return 1;
          }
        }
      }
      else {
        for (ifrom[3] = 0; ifrom[3] < 4; ifrom[3] = ifrom[3] + 1) {
          iVar1 = h264_prev_intra_pred_mode_flag
                            (str,cabac,mb->prev_intra8x8_pred_mode_flag + ifrom[3]);
          if (iVar1 != 0) {
            return 1;
          }
          if ((mb->prev_intra8x8_pred_mode_flag[ifrom[3]] == 0) &&
             (iVar1 = h264_rem_intra_pred_mode(str,cabac,mb->rem_intra8x8_pred_mode + ifrom[3]),
             iVar1 != 0)) {
            return 1;
          }
        }
      }
    }
    if ((slice->chroma_array_type == 1) || (slice->chroma_array_type == 2)) {
      iVar1 = h264_intra_chroma_pred_mode(str,cabac,&mb->intra_chroma_pred_mode);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = infer_intra(str,mb,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = infer_intra(str,mb,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else if (mb->mb_type == 0x21) {
    iVar1 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = infer_intra(str,mb,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = infer_intra(str,mb,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    pmode[2] = -1;
    local_58 = mb_part_info[mb->mb_type][1];
    iVar1 = mb_part_info[mb->mb_type][0];
    if (iVar1 == 0) {
      pmode[3] = 0;
    }
    else if (iVar1 == 1) {
      pmode[3] = 0;
      pmode[0] = mb_part_info[mb->mb_type][2];
    }
    else if (iVar1 == 2) {
      pmode[3] = -1;
      max = mb_part_info[mb->mb_type][2];
    }
    local_5c = slice->num_ref_idx_l0_active_minus1;
    if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
      local_5c = local_5c * 2 + 1;
    }
    for (ifrom[3] = 0; ifrom[3] < 4; ifrom[3] = ifrom[3] + 1) {
      if (pmode[(long)ifrom[3] + 2] == -1) {
        if (((&local_58)[ifrom[3]] & 1) == 0) {
          iVar1 = vs_infer(str,mb->ref_idx[0] + ifrom[3],0);
          if (iVar1 != 0) {
            return 1;
          }
        }
        else {
          iVar1 = h264_ref_idx(str,cabac,ifrom[3],0,local_5c,mb->ref_idx[0] + ifrom[3]);
          if (iVar1 != 0) {
            return 1;
          }
        }
      }
      else {
        iVar1 = vs_infer(str,mb->ref_idx[0] + ifrom[3],mb->ref_idx[0][pmode[(long)ifrom[3] + 2]]);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    local_5c = slice->num_ref_idx_l1_active_minus1;
    if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
      local_5c = local_5c * 2 + 1;
    }
    for (ifrom[3] = 0; ifrom[3] < 4; ifrom[3] = ifrom[3] + 1) {
      if (pmode[(long)ifrom[3] + 2] == -1) {
        if (((&local_58)[ifrom[3]] & 2) == 0) {
          iVar1 = vs_infer(str,mb->ref_idx[1] + ifrom[3],0);
          if (iVar1 != 0) {
            return 1;
          }
        }
        else {
          iVar1 = h264_ref_idx(str,cabac,ifrom[3],1,local_5c,mb->ref_idx[1] + ifrom[3]);
          if (iVar1 != 0) {
            return 1;
          }
        }
      }
      else {
        iVar1 = vs_infer(str,mb->ref_idx[1] + ifrom[3],mb->ref_idx[1][pmode[(long)ifrom[3] + 2]]);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    for (ifrom[3] = 0; ifrom[3] < 4; ifrom[3] = ifrom[3] + 1) {
      if (pmode[(long)ifrom[3] + 2] == -1) {
        if (((&local_58)[ifrom[3]] & 1) == 0) {
          iVar1 = vs_infers(str,mb->mvd[0][ifrom[3] << 2],0);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = vs_infers(str,mb->mvd[0][ifrom[3] << 2] + 1,0);
          if (iVar1 != 0) {
            return 1;
          }
        }
        else {
          iVar1 = h264_mvd(str,cabac,ifrom[3] << 2,0,0,mb->mvd[0][ifrom[3] << 2]);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = h264_mvd(str,cabac,ifrom[3] << 2,1,0,mb->mvd[0][ifrom[3] << 2] + 1);
          if (iVar1 != 0) {
            return 1;
          }
        }
      }
      else {
        iVar1 = vs_infers(str,mb->mvd[0][ifrom[3] << 2],
                          mb->mvd[0][pmode[(long)ifrom[3] + 2] << 2][0]);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = vs_infers(str,mb->mvd[0][ifrom[3] << 2] + 1,
                          mb->mvd[0][pmode[(long)ifrom[3] + 2] << 2][1]);
        if (iVar1 != 0) {
          return 1;
        }
      }
      for (ifrom[2] = 1; ifrom[2] < 4; ifrom[2] = ifrom[2] + 1) {
        iVar1 = vs_infers(str,mb->mvd[0][ifrom[3] * 4 + ifrom[2]],mb->mvd[0][ifrom[3] << 2][0]);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = vs_infers(str,mb->mvd[0][ifrom[3] * 4 + ifrom[2]] + 1,mb->mvd[0][ifrom[3] << 2][1]);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    for (ifrom[3] = 0; ifrom[3] < 4; ifrom[3] = ifrom[3] + 1) {
      if (pmode[(long)ifrom[3] + 2] == -1) {
        if (((&local_58)[ifrom[3]] & 2) == 0) {
          iVar1 = vs_infers(str,mb->mvd[1][ifrom[3] << 2],0);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = vs_infers(str,(*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[ifrom[3] << 2] + 1
                            ,0);
          if (iVar1 != 0) {
            return 1;
          }
        }
        else {
          iVar1 = h264_mvd(str,cabac,ifrom[3] << 2,0,1,mb->mvd[1][ifrom[3] << 2]);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = h264_mvd(str,cabac,ifrom[3] << 2,1,1,
                           (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[ifrom[3] << 2] + 1);
          if (iVar1 != 0) {
            return 1;
          }
        }
      }
      else {
        iVar1 = vs_infers(str,mb->mvd[1][ifrom[3] << 2],
                          mb->mvd[1][pmode[(long)ifrom[3] + 2] << 2][0]);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = vs_infers(str,(*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[ifrom[3] << 2] + 1,
                          (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))
                          [pmode[(long)ifrom[3] + 2] << 2][1]);
        if (iVar1 != 0) {
          return 1;
        }
      }
      for (ifrom[2] = 1; ifrom[2] < 4; ifrom[2] = ifrom[2] + 1) {
        iVar1 = vs_infers(str,mb->mvd[1][ifrom[3] * 4 + ifrom[2]],mb->mvd[1][ifrom[3] << 2][0]);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = vs_infers(str,(*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))
                              [ifrom[3] * 4 + ifrom[2]] + 1,
                          (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[ifrom[3] << 2][1]);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    iVar1 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int h264_mb_pred(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	int i, j;
	if (mb->mb_type < H264_MB_TYPE_P_BASE) {
		if (!h264_is_intra_16x16_mb_type(mb->mb_type)) {
			if (!mb->transform_size_8x8_flag) {
				for (i = 0; i < 16; i++) {
					if (h264_prev_intra_pred_mode_flag(str, cabac, &mb->prev_intra4x4_pred_mode_flag[i])) return 1;
					if (!mb->prev_intra4x4_pred_mode_flag[i])
						if (h264_rem_intra_pred_mode(str, cabac, &mb->rem_intra4x4_pred_mode[i])) return 1;
				}
			} else {
				for (i = 0; i < 4; i++) {
					if (h264_prev_intra_pred_mode_flag(str, cabac, &mb->prev_intra8x8_pred_mode_flag[i])) return 1;
					if (!mb->prev_intra8x8_pred_mode_flag[i])
						if (h264_rem_intra_pred_mode(str, cabac, &mb->rem_intra8x8_pred_mode[i])) return 1;
				}
			}
		}
		if (slice->chroma_array_type == 1 || slice->chroma_array_type == 2) {
			if (h264_intra_chroma_pred_mode(str, cabac, &mb->intra_chroma_pred_mode)) return 1;
		} else {
			if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		}
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
	} else if (mb->mb_type != H264_MB_TYPE_B_DIRECT_16X16) {
		int ifrom[4], pmode[4];
		ifrom[0] = -1;
		pmode[0] = mb_part_info[mb->mb_type][1];
		switch (mb_part_info[mb->mb_type][0]) {
			case 0: /* 16x16 */
				ifrom[1] = 0;
				ifrom[2] = 0;
				ifrom[3] = 0;
				break;
			case 1: /* 16x8 */
				ifrom[1] = 0;
				ifrom[2] = -1;
				ifrom[3] = 2;
				pmode[2] = mb_part_info[mb->mb_type][2];
				break;
			case 2:
				ifrom[1] = -1;
				ifrom[2] = 0;
				ifrom[3] = 1;
				pmode[1] = mb_part_info[mb->mb_type][2];
				break;
		}
		int max = slice->num_ref_idx_l0_active_minus1;
		if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
			max *= 2, max++;
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 1) {
					if (h264_ref_idx(str, cabac, i, 0, max, &mb->ref_idx[0][i])) return 1;
				} else {
					if (vs_infer(str, &mb->ref_idx[0][i], 0)) return 1;
				}
			} else {
				if (vs_infer(str, &mb->ref_idx[0][i], mb->ref_idx[0][ifrom[i]])) return 1;
			}
		}
		max = slice->num_ref_idx_l1_active_minus1;
		if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
			max *= 2, max++;
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 2) {
					if (h264_ref_idx(str, cabac, i, 1, max, &mb->ref_idx[1][i])) return 1;
				} else {
					if (vs_infer(str, &mb->ref_idx[1][i], 0)) return 1;
				}
			} else {
				if (vs_infer(str, &mb->ref_idx[1][i], mb->ref_idx[1][ifrom[i]])) return 1;
			}
		}
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 1) {
					if (h264_mvd(str, cabac, i * 4, 0, 0, &mb->mvd[0][i*4][0])) return 1;
					if (h264_mvd(str, cabac, i * 4, 1, 0, &mb->mvd[0][i*4][1])) return 1;
				} else {
					if (vs_infers(str, &mb->mvd[0][i*4][0], 0)) return 1;
					if (vs_infers(str, &mb->mvd[0][i*4][1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &mb->mvd[0][i*4][0], mb->mvd[0][ifrom[i]*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[0][i*4][1], mb->mvd[0][ifrom[i]*4][1])) return 1;
			}
			for (j = 1; j < 4; j++) {
				if (vs_infers(str, &mb->mvd[0][i*4+j][0], mb->mvd[0][i*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[0][i*4+j][1], mb->mvd[0][i*4][1])) return 1;
			}
		}
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 2) {
					if (h264_mvd(str, cabac, i * 4, 0, 1, &mb->mvd[1][i*4][0])) return 1;
					if (h264_mvd(str, cabac, i * 4, 1, 1, &mb->mvd[1][i*4][1])) return 1;
				} else {
					if (vs_infers(str, &mb->mvd[1][i*4][0], 0)) return 1;
					if (vs_infers(str, &mb->mvd[1][i*4][1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &mb->mvd[1][i*4][0], mb->mvd[1][ifrom[i]*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[1][i*4][1], mb->mvd[1][ifrom[i]*4][1])) return 1;
			}
			for (j = 1; j < 4; j++) {
				if (vs_infers(str, &mb->mvd[1][i*4+j][0], mb->mvd[1][i*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[1][i*4+j][1], mb->mvd[1][i*4][1])) return 1;
			}
		}
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	} else {
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
	}
	return 0;
}